

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListB
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  uint key2;
  QName *pQVar1;
  XMLCh *key1;
  GrammarResolver *this_00;
  XMLEnumerator<xercesc_4_0::SchemaInfo> XVar2;
  bool bVar3;
  int iVar4;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar5;
  undefined4 extraout_var;
  Grammar *pGVar6;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  SchemaInfo *pSVar7;
  SchemaElementDecl *local_80;
  BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> importingEnum;
  SchemaElementDecl *elemDecl_local;
  
  local_80 = subsElemDecl->fSubstitutionGroupElem;
  XVar2._vptr_XMLEnumerator =
       importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator;
  elemDecl_local = elemDecl;
  while( true ) {
    importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator =
         XVar2._vptr_XMLEnumerator;
    if (local_80 == (SchemaElementDecl *)0x0) {
      return;
    }
    pQVar1 = (local_80->super_XMLElementDecl).fElementName;
    key2 = pQVar1->fURIId;
    key1 = pQVar1->fLocalPart;
    pVVar5 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fValidSubstitutionGroups,key1,key2);
    if (pVVar5 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      if (this->fTargetNSURI == key2) {
        return;
      }
      this_00 = this->fGrammarResolver;
      iVar4 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fURIStringPool,(ulong)key2);
      pGVar6 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar4));
      if (pGVar6 == (Grammar *)0x0) {
        return;
      }
      toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                      *)pGVar6[10].super_XSerializable._vptr_XSerializable,key1,key2);
      if (toCopy == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
        return;
      }
      pVVar5 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
               XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar5,toCopy);
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fValidSubstitutionGroups,key1,key2,pVVar5);
    }
    bVar3 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                      (pVVar5,&elemDecl_local,0);
    if (bVar3) {
      return;
    }
    bVar3 = isSubstitutionGroupValid
                      (this,elem,local_80,elemDecl_local->fComplexTypeInfo,
                       elemDecl_local->fDatatypeValidator,(XMLCh *)0x0,false);
    if (!bVar3) break;
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(pVVar5,&elemDecl_local);
    importingEnum.fToEnum =
         &this->fSchemaInfo->fImportingInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
    importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator =
         (_func_int **)&PTR__BaseRefVectorEnumerator_00408218;
    importingEnum.fAdopted = false;
    importingEnum.fCurIndex = 0;
    while (importingEnum.fCurIndex < (importingEnum.fToEnum)->fCurCount) {
      pSVar7 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::nextElement(&importingEnum);
      pGVar6 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar7->fTargetNSURIString);
      pVVar5 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                      *)pGVar6[10].super_XSerializable._vptr_XSerializable,key1,key2);
      if ((pVVar5 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) &&
         (bVar3 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                            (pVVar5,&elemDecl_local,0), !bVar3)) {
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(pVVar5,&elemDecl_local);
      }
    }
    local_80 = local_80->fSubstitutionGroupElem;
    importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator =
         (_func_int **)&PTR__BaseRefVectorEnumerator_00408218;
    XVar2._vptr_XMLEnumerator = (_func_int **)&PTR__BaseRefVectorEnumerator_00408218;
    if (importingEnum.fAdopted == true) {
      (*(importingEnum.fToEnum)->_vptr_BaseRefVectorOf[1])();
      XVar2 = importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>;
    }
  }
  return;
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListB(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    SchemaElementDecl* chainElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (chainElemDecl) {

        int chainElemURI = chainElemDecl->getURI();
        XMLCh* chainElemName = chainElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubsElements =
            fValidSubstitutionGroups->get(chainElemName, chainElemURI);

        if (!validSubsElements) {

            if (fTargetNSURI == chainElemURI) {
                break; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(chainElemURI));

            if (!aGrammar)
                break;

            validSubsElements = aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (!validSubsElements) {
                break;
            }

            validSubsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubsElements);
            fValidSubstitutionGroups->put((void*) chainElemName, chainElemURI, validSubsElements);
        }

        if (validSubsElements->containsElement(elemDecl) ||
            !isSubstitutionGroupValid(elem, chainElemDecl, elemDecl->getComplexTypeInfo(),
                                      elemDecl->getDatatypeValidator(), 0, false)) {
            break;
        }

        validSubsElements->addElement(elemDecl);

        // update related subs. info in case of circular import
        BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

        while (importingEnum.hasMoreElements()) {

            const SchemaInfo& curRef = importingEnum.nextElement();
            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
            ValueVectorOf<SchemaElementDecl*>* subsElemList =
                aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (subsElemList && !subsElemList->containsElement(elemDecl)) {
                subsElemList->addElement(elemDecl);
            }
        }

        chainElemDecl = chainElemDecl->getSubstitutionGroupElem();
    }
}